

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

string * setup::filename_map::shorten_path(string *__return_storage_ptr__,string *path)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (path->_M_string_length != 0) {
    pcVar4 = (path->_M_dataplus)._M_p;
    pcVar5 = pcVar4 + path->_M_string_length;
    do {
      lVar3 = (long)pcVar5 - (long)pcVar4 >> 2;
      pcVar1 = pcVar4;
      if (0 < lVar3) {
        pcVar1 = pcVar4 + ((long)pcVar5 - (long)pcVar4 & 0xfffffffffffffffc);
        lVar3 = lVar3 + 1;
        pcVar6 = pcVar4 + 3;
        do {
          if ((pcVar6[-3] == '/') || (pcVar6[-3] == '\\')) {
            pcVar6 = pcVar6 + -3;
            goto LAB_00136c75;
          }
          if ((pcVar6[-2] == '/') || (pcVar6[-2] == '\\')) {
            pcVar6 = pcVar6 + -2;
            goto LAB_00136c75;
          }
          if ((pcVar6[-1] == '/') || (pcVar6[-1] == '\\')) {
            pcVar6 = pcVar6 + -1;
            goto LAB_00136c75;
          }
          if ((*pcVar6 == '/') || (*pcVar6 == '\\')) goto LAB_00136c75;
          lVar3 = lVar3 + -1;
          pcVar6 = pcVar6 + 4;
        } while (1 < lVar3);
      }
      lVar3 = (long)pcVar5 - (long)pcVar1;
      if (lVar3 == 1) {
LAB_00136c62:
        pcVar6 = pcVar1;
        if ((*pcVar1 != '/') && (*pcVar1 != '\\')) {
          pcVar6 = pcVar5;
        }
      }
      else if (lVar3 == 2) {
LAB_00136c3c:
        pcVar6 = pcVar1;
        if ((*pcVar1 != '/') && (*pcVar1 != '\\')) {
          pcVar1 = pcVar1 + 1;
          goto LAB_00136c62;
        }
      }
      else {
        pcVar6 = pcVar5;
        if (((lVar3 == 3) && (pcVar6 = pcVar1, *pcVar1 != '/')) && (*pcVar1 != '\\')) {
          pcVar1 = pcVar1 + 1;
          goto LAB_00136c3c;
        }
      }
LAB_00136c75:
      pcVar1 = pcVar6 + 1;
      if (pcVar6 == pcVar5) {
        pcVar1 = pcVar5;
      }
      if ((pcVar6 != pcVar4) && (((long)pcVar6 - (long)pcVar4 != 1 || (*pcVar4 != '.')))) {
        if (((long)pcVar6 - (long)pcVar4 == 2) && ((*pcVar4 == '.' && (pcVar4[1] == '.')))) {
          lVar2 = std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f);
          lVar3 = 0;
          if (lVar2 != -1) {
            lVar3 = lVar2;
          }
          std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar3);
        }
        else {
          if (__return_storage_ptr__->_M_string_length != 0) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
          }
          std::__cxx11::string::replace
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                     (char *)0x0,(ulong)pcVar4);
        }
      }
      pcVar4 = pcVar1;
    } while (pcVar1 != pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename_map::shorten_path(const std::string & path) {
	
	std::string result;
	result.reserve(path.size());
	
	it begin = path.begin();
	it end = path.end();
	while(begin != end) {
		
		it s_begin = begin;
		it s_end = std::find_if(begin, end, is_path_separator());
		begin = (s_end == end) ? end : (s_end + 1);
		
		size_t segment_length = size_t(s_end - s_begin);
		
		// Empty segment - ignore
		if(segment_length == 0) {
			continue;
		}
		
		// '.' segment - ignore
		if(segment_length == 1 && *s_begin == '.') {
			continue;
		}
		
		// '..' segment - backtrace in result path
		if(segment_length == 2 && *s_begin == '.' && *(s_begin + 1) == '.') {
			size_t last_sep = result.find_last_of(path_sep);
			if(last_sep == std::string::npos) {
				last_sep = 0;
			}
			result.resize(last_sep);
			continue;
		}
		
		// Normal segment - append to the result path
		if(!result.empty()) {
			result.push_back(path_sep);
		}
		result.append(s_begin, s_end);
		
	}
	
	return result;
}